

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  value_type *pvVar1;
  int iVar2;
  CppType CVar3;
  undefined4 extraout_var;
  MapValueRef *pMVar4;
  undefined4 extraout_var_00;
  FieldDescriptor *this_00;
  undefined4 extraout_var_01;
  long *plVar5;
  undefined8 *puVar6;
  int *piVar7;
  allocator local_69;
  string local_68;
  iterator iter;
  
  iVar2 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x11])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find
            (&iter,(Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                   CONCAT44(extraout_var,iVar2),map_key);
  if (iter.it_.node_ == (Node *)0x0) {
    pMVar4 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                       ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
                        CONCAT44(extraout_var,iVar2),map_key);
    iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
    std::__cxx11::string::string((string *)&local_68,"value",&local_69);
    this_00 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var_00,iVar2),&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    CVar3 = FieldDescriptor::cpp_type(this_00);
    piVar7 = &pMVar4->type_;
    pMVar4->type_ = CVar3;
    CVar3 = FieldDescriptor::cpp_type(this_00);
    switch(CVar3) {
    case CPPTYPE_INT32:
    case CPPTYPE_UINT32:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
      puVar6 = (undefined8 *)operator_new(4);
      *(undefined4 *)puVar6 = 0;
      break;
    case CPPTYPE_INT64:
    case CPPTYPE_UINT64:
    case CPPTYPE_DOUBLE:
      puVar6 = (undefined8 *)operator_new(8);
      *puVar6 = 0;
      break;
    case CPPTYPE_BOOL:
      puVar6 = (undefined8 *)operator_new(1);
      *(undefined1 *)puVar6 = 0;
      break;
    case CPPTYPE_STRING:
      puVar6 = (undefined8 *)operator_new(0x20);
      *puVar6 = puVar6 + 2;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      break;
    case CPPTYPE_MESSAGE:
      iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
      plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0xd8))
                                 ((long *)CONCAT44(extraout_var_01,iVar2),this->default_entry_,
                                  this_00,0);
      puVar6 = (undefined8 *)(**(code **)(*plVar5 + 0x18))(plVar5);
      break;
    default:
      goto switchD_003218f5_default;
    }
    pMVar4->data_ = puVar6;
  }
  else {
    pvVar1 = ((iter.it_.node_)->kv).v_;
    pMVar4 = &pvVar1->second;
    piVar7 = &(pvVar1->second).type_;
  }
switchD_003218f5_default:
  val->type_ = *piVar7;
  val->data_ = pMVar4->data_;
  return iter.it_.node_ == (Node *)0x0;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(
    const MapKey& map_key, MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    // Insert
    MapValueRef& map_val = (*map)[map_key];
    const FieldDescriptor* val_des =
        default_entry_->GetDescriptor()->FindFieldByName("value");
    map_val.SetType(val_des->cpp_type());
    // Allocate memory for the inserted MapValueRef, and initialize to
    // default value.
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                              \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        TYPE * value = new TYPE();                              \
        map_val.SetValue(value);                                \
        break;                                                  \
      }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = default_entry_->GetReflection()->GetMessage(
            *default_entry_, val_des);
        Message* value = message.New();
        map_val.SetValue(value);
        break;
      }
    }
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}